

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  ImDrawList *this;
  ImDrawCmd *__src;
  undefined1 local_90 [8];
  ImDrawCmd cmd;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImDrawList *local_38;
  ImDrawList *draw_list;
  ImRect viewport_rect;
  ImGuiViewportP *viewport;
  ImU32 col_local;
  ImGuiWindow *window_local;
  
  if ((col & 0xff000000) != 0) {
    viewport_rect.Max = (ImVec2)GetMainViewport();
    _draw_list = ImGuiViewportP::GetMainRect((ImGuiViewportP *)viewport_rect.Max);
    local_38 = window->RootWindow->DrawList;
    if ((local_38->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(local_38);
    }
    this = local_38;
    ImVec2::ImVec2(&local_48,1.0,1.0);
    local_40 = ::operator-((ImVec2 *)&draw_list,&local_48);
    ImVec2::ImVec2((ImVec2 *)&cmd.UserCallbackData,1.0,1.0);
    local_50 = operator+(&viewport_rect.Min,(ImVec2 *)&cmd.UserCallbackData);
    ImDrawList::PushClipRect(this,&local_40,&local_50,false);
    ImDrawList::AddRectFilled(local_38,(ImVec2 *)&draw_list,&viewport_rect.Min,col,0.0,0);
    __src = ImVector<ImDrawCmd>::back(&local_38->CmdBuffer);
    memcpy(local_90,__src,0x38);
    if (cmd.VtxOffset != 6) {
      __assert_fail("cmd.ElemCount == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x129f,"void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *, ImU32)");
    }
    ImVector<ImDrawCmd>::pop_back(&local_38->CmdBuffer);
    ImVector<ImDrawCmd>::push_front(&local_38->CmdBuffer,(ImDrawCmd *)local_90);
    ImDrawList::PopClipRect(local_38);
    ImDrawList::AddDrawCmd(local_38);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }
}